

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::AddGlobalTarget_Test
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer puVar3;
  __uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_> _Var4;
  pointer pbVar5;
  size_type sVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string *__x;
  size_t sVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer __x_00;
  char *__end;
  long lVar10;
  cmCustomCommandLine singleLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  GlobalTargetInfo gti;
  string local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *local_e0;
  pointer local_d8;
  GlobalTargetInfo local_d0;
  char *__s;
  
  puVar3 = (this->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var4._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (puVar3->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t;
  local_d0.Name._M_dataplus._M_p = (pointer)&local_d0.Name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CMAKE_TESTING_ENABLED","");
  bVar7 = cmMakefile::IsOn((cmMakefile *)
                           _Var4._M_t.
                           super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&local_d0.Name);
  local_e0 = targets;
  local_d8 = puVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.Name._M_dataplus._M_p != &local_d0.Name.field_2) {
    operator_delete(local_d0.Name._M_dataplus._M_p,
                    CONCAT71(local_d0.Name.field_2._M_allocated_capacity._1_7_,
                             local_d0.Name.field_2._M_local_buf[0]) + 1);
  }
  if (bVar7) {
    lVar10 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,
                 *(char **)((long)&AddGlobalTarget_Test(std::vector<cmGlobalGenerator::GlobalTargetInfo,std::allocator<cmGlobalGenerator::GlobalTargetInfo>>&)
                                   ::reservedTargets + lVar10),(allocator<char> *)&local_118);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"when CTest testing is enabled","");
      bVar7 = CheckCMP0037(this,&local_d0.Name,&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.Name._M_dataplus._M_p != &local_d0.Name.field_2) {
        operator_delete(local_d0.Name._M_dataplus._M_p,
                        CONCAT71(local_d0.Name.field_2._M_allocated_capacity._1_7_,
                                 local_d0.Name.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar7) {
        return;
      }
      lVar10 = lVar10 + 8;
    } while (lVar10 != 0x10);
    iVar8 = (*this->_vptr_cmGlobalGenerator[0x15])(this);
    __s = (char *)CONCAT44(extraout_var,iVar8);
    paVar1 = &local_d0.Message.field_2;
    local_d0.Name._M_dataplus._M_p = (pointer)&local_d0.Name.field_2;
    local_d0.Name._M_string_length = 0;
    local_d0.Name.field_2._M_local_buf[0] = '\0';
    local_d0.Message._M_string_length = 0;
    local_d0.Message.field_2._M_local_buf[0] = '\0';
    paVar2 = &local_d0.WorkingDir.field_2;
    local_d0.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d0.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d0.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d0.Depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d0.Depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d0.Depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d0.WorkingDir._M_string_length = 0;
    local_d0.WorkingDir.field_2._M_local_buf[0] = '\0';
    local_d0.UsesTerminal = false;
    local_d0.PerConfig = Yes;
    local_d0.StdPipesUTF8 = false;
    local_d0.Message._M_dataplus._M_p = (pointer)paVar1;
    local_d0.WorkingDir._M_dataplus._M_p = (pointer)paVar2;
    iVar8 = (*this->_vptr_cmGlobalGenerator[0x1e])(this);
    sVar6 = local_d0.Name._M_string_length;
    strlen((char *)CONCAT44(extraout_var_00,iVar8));
    std::__cxx11::string::_M_replace
              ((ulong)&local_d0,0,(char *)sVar6,CONCAT44(extraout_var_00,iVar8));
    std::__cxx11::string::_M_replace
              ((ulong)&local_d0.Message,0,(char *)local_d0.Message._M_string_length,0x6ed1c6);
    local_d0.UsesTerminal = true;
    local_118.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __x = cmSystemTools::GetCTestCommand_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_118,__x);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"--force-new-ctest-process","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
               &local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _Var4._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
    super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
         (local_d8->_M_t).super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"CMAKE_CTEST_ARGUMENTS","")
    ;
    bVar7 = cmMakefile::GetDefExpandList
                      ((cmMakefile *)
                       _Var4._M_t.
                       super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                       super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&local_138,&local_f8,
                       false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    pbVar5 = local_f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((bVar7) &&
       (local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      __x_00 = local_f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_118,__x_00);
        __x_00 = __x_00 + 1;
      } while (__x_00 != pbVar5);
    }
    if (((__s == (char *)0x0) || (*__s == '\0')) || (*__s == '.')) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"$(ARGS)","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
                 &local_138);
    }
    else {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"-C","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
                 &local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      sVar9 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,__s,__s + sVar9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_118,
                 &local_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
    emplace_back<cmCustomCommandLine>
              (&local_d0.CommandLines.
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
               (cmCustomCommandLine *)&local_118);
    std::
    vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
    ::emplace_back<cmGlobalGenerator::GlobalTargetInfo>(local_e0,&local_d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.WorkingDir._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0.WorkingDir._M_dataplus._M_p,
                      CONCAT71(local_d0.WorkingDir.field_2._M_allocated_capacity._1_7_,
                               local_d0.WorkingDir.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d0.Depends);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
              (&local_d0.CommandLines.
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.Message._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0.Message._M_dataplus._M_p,
                      CONCAT71(local_d0.Message.field_2._M_allocated_capacity._1_7_,
                               local_d0.Message.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.Name._M_dataplus._M_p != &local_d0.Name.field_2) {
      operator_delete(local_d0.Name._M_dataplus._M_p,
                      CONCAT71(local_d0.Name.field_2._M_allocated_capacity._1_7_,
                               local_d0.Name.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_Test(
  std::vector<GlobalTargetInfo>& targets)
{
  auto& mf = this->Makefiles[0];
  if (!mf->IsOn("CMAKE_TESTING_ENABLED")) {
    return;
  }

  static const auto reservedTargets = { "test", "RUN_TESTS" };
  for (auto const& target : reservedTargets) {
    if (!this->CheckCMP0037(target, "when CTest testing is enabled")) {
      return;
    }
  }

  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();
  GlobalTargetInfo gti;
  gti.Name = this->GetTestTargetName();
  gti.Message = "Running tests...";
  gti.UsesTerminal = true;
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCTestCommand());
  singleLine.push_back("--force-new-ctest-process");
  std::vector<std::string> args;
  if (mf->GetDefExpandList("CMAKE_CTEST_ARGUMENTS", args)) {
    for (auto const& arg : args) {
      singleLine.push_back(arg);
    }
  }
  if (cmNonempty(cmakeCfgIntDir) && cmakeCfgIntDir[0] != '.') {
    singleLine.push_back("-C");
    singleLine.push_back(cmakeCfgIntDir);
  } else // TODO: This is a hack. Should be something to do with the
         // generator
  {
    singleLine.push_back("$(ARGS)");
  }
  gti.CommandLines.push_back(std::move(singleLine));
  targets.push_back(std::move(gti));
}